

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_any.h
# Opt level: O0

void UnitTests::stream_any_details::
     output_range_or_type<UnitTests::Assert::Range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>>
               (ostream *s,
               Range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
               *t,true_type *param_3)

{
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  Range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_> *s_00;
  bool bVar1;
  reference t_00;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_48;
  outputter<int> local_40;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_38;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_28;
  true_type *local_20;
  true_type *param_2_local;
  Range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_> *t_local;
  ostream *s_local;
  
  local_20 = param_3;
  param_2_local = (true_type *)t;
  t_local = (Range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_> *)
            s;
  std::operator<<(s,"[");
  local_28 = std::
             begin<UnitTests::Assert::Range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>>
                       ((Range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
                         *)param_2_local);
  first = std::
          end<UnitTests::Assert::Range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>>
                    ((Range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
                      *)param_2_local);
  bVar1 = __gnu_cxx::operator!=(&local_28,&first);
  if (bVar1) {
    local_38 = std::
               begin<UnitTests::Assert::Range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>>
                         ((Range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
                           *)param_2_local);
    s_00 = t_local;
    local_48 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator++(&local_38,0);
    t_00 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                     (&local_48);
    local_40 = stream_any<int>(t_00);
    operator<<((ostream *)s_00,&local_40);
    __first._M_current = local_38._M_current;
    __last = std::
             end<UnitTests::Assert::Range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>>
                       ((Range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
                         *)param_2_local);
    std::
    for_each<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,UnitTests::stream_any_details::output_range_or_type<UnitTests::Assert::Range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>>(std::ostream&,UnitTests::Assert::Range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>const&,std::integral_constant<bool,true>const&)::_lambda(auto:1_const&)_1_>
              (__first,__last,(anon_class_8_1_54a39813)t_local);
  }
  std::operator<<((ostream *)t_local,"]");
  return;
}

Assistant:

void output_range_or_type(std::ostream& s, const T& t, const std::true_type& /*unused*/)
        {
            s << "[";
            if (begin(t) != end(t))
            {
                auto first = begin(t);
                s << stream_any(*first++);
                std::for_each(first, end(t), [&s](const auto& value) { s << ", " << stream_any(value); });
            }
            s << "]";
        }